

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O0

uint8 * google::protobuf::internal::WireFormat::InternalSerializeMessageSetItem
                  (FieldDescriptor *field,Message *message,uint8 *target,EpsCopyOutputStream *stream
                  )

{
  uint32 uVar1;
  uint32 value;
  int iVar2;
  Reflection *ptr;
  uint8 *puVar3;
  Message *pMVar4;
  undefined4 extraout_var;
  EpsCopyOutputStream *in_RCX;
  uint8 *in_RDX;
  MessageFactory *in_RSI;
  FieldDescriptor *in_RDI;
  Reflection *message_reflection;
  EpsCopyOutputStream *this;
  Message *in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  
  ptr = Message::GetReflection((Message *)in_RCX);
  io::EpsCopyOutputStream::EnsureSpace(in_RCX,(uint8 **)ptr);
  puVar3 = io::CodedOutputStream::WriteVarint32ToArray(0xb,in_RDX);
  uVar1 = FieldDescriptor::number(in_RDI);
  value = WireFormatLite::MakeTag(2,WIRETYPE_VARINT);
  puVar3 = io::CodedOutputStream::WriteVarint32ToArray(value,puVar3);
  puVar3 = io::CodedOutputStream::WriteVarint32ToArray(uVar1,puVar3);
  pMVar4 = Reflection::GetMessage
                     ((Reflection *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                      in_stack_ffffffffffffff60,in_RDI,in_RSI);
  this = in_RCX;
  uVar1 = WireFormatLite::MakeTag(3,WIRETYPE_LENGTH_DELIMITED);
  puVar3 = io::CodedOutputStream::WriteVarint32ToArray(uVar1,puVar3);
  uVar1 = (*(pMVar4->super_MessageLite)._vptr_MessageLite[0xc])();
  puVar3 = io::CodedOutputStream::WriteVarint32ToArray(uVar1,puVar3);
  iVar2 = (*(pMVar4->super_MessageLite)._vptr_MessageLite[0xe])(pMVar4,puVar3,in_RCX);
  io::EpsCopyOutputStream::EnsureSpace(this,(uint8 **)ptr);
  puVar3 = io::CodedOutputStream::WriteVarint32ToArray(0xc,(uint8 *)CONCAT44(extraout_var,iVar2));
  return puVar3;
}

Assistant:

uint8* WireFormat::InternalSerializeMessageSetItem(
    const FieldDescriptor* field, const Message& message, uint8* target,
    io::EpsCopyOutputStream* stream) {
  const Reflection* message_reflection = message.GetReflection();

  stream->EnsureSpace(&target);
  // Start group.
  target = io::CodedOutputStream::WriteTagToArray(
      WireFormatLite::kMessageSetItemStartTag, target);
  // Write type ID.
  target = WireFormatLite::WriteUInt32ToArray(
      WireFormatLite::kMessageSetTypeIdNumber, field->number(), target);
  // Write message.
  target = WireFormatLite::InternalWriteMessageToArray(
      WireFormatLite::kMessageSetMessageNumber,
      message_reflection->GetMessage(message, field), target, stream);
  // End group.
  stream->EnsureSpace(&target);
  target = io::CodedOutputStream::WriteTagToArray(
      WireFormatLite::kMessageSetItemEndTag, target);
  return target;
}